

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

shared_ptr<duckdb::RowGroupCollection,_true> __thiscall
duckdb::RowGroupCollection::AlterType
          (RowGroupCollection *this,ClientContext *context,idx_t changed_idx,
          LogicalType *target_type,vector<duckdb::StorageIndex,_true> *bound_columns,
          Expression *cast_expr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var1;
  undefined1 auVar2 [8];
  reference pvVar3;
  RowGroupCollection *pRVar4;
  reference pvVar5;
  DataTableInfo *pDVar6;
  Allocator *allocator;
  reference this_00;
  type this_01;
  RowGroupSegmentTree *this_02;
  RowGroup *segment;
  type target_type_00;
  pointer this_03;
  BaseStatistics *other;
  ColumnData *this_04;
  RowGroupSegmentTree *this_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type __n;
  shared_ptr<duckdb::RowGroupCollection,_true> sVar7;
  Expression *in_stack_00000008;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_310;
  ExpressionExecutor *local_308;
  undefined1 local_300 [8];
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  lock;
  vector<duckdb::LogicalType,_true> scan_types;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_2b8;
  vector<duckdb::LogicalType,_true> new_types;
  DataChunk scan_chunk;
  ExpressionExecutor executor;
  TableScanState scan_state;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&new_types,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context->registered_state);
  local_308 = (ExpressionExecutor *)target_type;
  pvVar3 = vector<duckdb::LogicalType,_true>::operator[](&new_types,(size_type)target_type);
  if (pvVar3 != (reference)bound_columns) {
    pvVar3->id_ = *(LogicalTypeId *)
                   &(bound_columns->
                    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    pvVar3->physical_type_ =
         *(PhysicalType *)
          ((long)&(bound_columns->
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&pvVar3->type_info_,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
               &(bound_columns->
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish);
  }
  __args = &(context->db).internal.
            super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  executor.expressions.
  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(context->db).internal.
                super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  scan_state.table_state.row_group = (RowGroup *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::RowGroupCollection,std::allocator<duckdb::RowGroupCollection>,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::BlockManager&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,unsigned_long,unsigned_long_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&scan_state.table_state.vector_index,
             (RowGroupCollection **)&scan_state,(allocator<duckdb::RowGroupCollection> *)&scan_chunk
             ,(shared_ptr<duckdb::DataTableInfo,_true> *)__args,
             (BlockManager *)
             (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&new_types,
             &(context->config).home_directory._M_string_length,(unsigned_long *)&executor,
             (unsigned_long *)
             &(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this->block_manager = (BlockManager *)scan_state.table_state.row_group;
  this->row_group_size = scan_state.table_state.vector_index;
  if (scan_state.table_state.vector_index != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(scan_state.table_state.vector_index + 8) =
           *(int *)(scan_state.table_state.vector_index + 8) + 1;
      UNLOCK();
      if (scan_state.table_state.vector_index == 0) goto LAB_006180d6;
    }
    else {
      *(int *)(scan_state.table_state.vector_index + 8) =
           *(int *)(scan_state.table_state.vector_index + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)scan_state.table_state.vector_index);
  }
LAB_006180d6:
  pRVar4 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::InitializeAlterType
            (&pRVar4->stats,(TableStatistics *)&(context->config).enable_profiler,(idx_t)local_308,
             (LogicalType *)bound_columns);
  scan_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  scan_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  scan_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(_func_int ***)&(cast_expr->super_BaseExpression).type !=
      (cast_expr->super_BaseExpression)._vptr_BaseExpression) {
    __n = 0;
    do {
      pvVar5 = vector<duckdb::StorageIndex,_true>::operator[]
                         ((vector<duckdb::StorageIndex,_true> *)cast_expr,__n);
      if (pvVar5->index == 0xffffffffffffffff) {
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalTypeId_const&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&scan_types,
                   &LogicalType::ROW_TYPE);
      }
      else {
        pvVar5 = vector<duckdb::StorageIndex,_true>::operator[]
                           ((vector<duckdb::StorageIndex,_true> *)cast_expr,__n);
        pvVar3 = vector<duckdb::LogicalType,_true>::operator[]
                           ((vector<duckdb::LogicalType,_true> *)&context->registered_state,
                            pvVar5->index);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&scan_types,
                   pvVar3);
      }
      __n = __n + 1;
    } while (__n < (ulong)(*(long *)&(cast_expr->super_BaseExpression).type -
                           (long)(cast_expr->super_BaseExpression)._vptr_BaseExpression >> 5));
  }
  DataChunk::DataChunk(&scan_chunk);
  pDVar6 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                     ((shared_ptr<duckdb::DataTableInfo,_true> *)__args);
  allocator = Allocator::Get(pDVar6->db);
  DataChunk::Initialize(&scan_chunk,allocator,&scan_types,0x800);
  ExpressionExecutor::ExpressionExecutor(&executor,(ClientContext *)changed_idx);
  ExpressionExecutor::AddExpression(&executor,in_stack_00000008);
  TableScanState::TableScanState(&scan_state);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
            (&local_2b8,
             (vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)cast_expr);
  TableScanState::Initialize
            (&scan_state,(vector<duckdb::StorageIndex,_true> *)&local_2b8,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_2b8);
  scan_state.table_state.max_row =
       (long)&(((context->db).internal.
                super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
              super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2> +
       (context->config).home_directory._M_string_length;
  shared_ptr<duckdb::RowGroupCollection,_true>::operator->
            ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::GetLock((TableStatistics *)&lock);
  pRVar4 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*(&lock);
  this_00 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                      (&(pRVar4->stats).column_stats,(size_type)local_308);
  this_01 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(this_00);
  this_02 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                      ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)
                       &(context->config).home_directory.field_2);
  segment = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                      (&this_02->super_SegmentTree<duckdb::RowGroup,_true>);
  for (; segment != (RowGroup *)0x0;
      segment = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&this_02->super_SegmentTree<duckdb::RowGroup,_true>,segment)) {
    target_type_00 =
         shared_ptr<duckdb::RowGroupCollection,_true>::operator*
                   ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    RowGroup::AlterType((RowGroup *)local_300,(RowGroupCollection *)segment,
                        (LogicalType *)target_type_00,(idx_t)bound_columns,local_308,
                        (CollectionScanState *)&executor,(DataChunk *)&scan_state);
    this_03 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                        ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                          *)local_300);
    other = ColumnStatistics::Statistics(this_01);
    this_04 = RowGroup::GetColumn(this_03,(storage_t)local_308);
    ColumnData::MergeIntoStatistics(this_04,other);
    pRVar4 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                       ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    this_05 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&pRVar4->row_groups);
    local_310._M_head_impl = (RowGroup *)local_300;
    local_300 = (undefined1  [8])0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&this_05->super_SegmentTree<duckdb::RowGroup,_true>,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_310);
    _Var1._M_head_impl = local_310._M_head_impl;
    if (local_310._M_head_impl != (RowGroup *)0x0) {
      RowGroup::~RowGroup(local_310._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
    auVar2 = local_300;
    local_310._M_head_impl = (RowGroup *)0x0;
    if (local_300 != (undefined1  [8])0x0) {
      RowGroup::~RowGroup((RowGroup *)local_300);
      operator_delete((void *)auVar2);
    }
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  TableScanState::~TableScanState(&scan_state);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&executor.states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  if (executor.expressions.
      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(executor.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  DataChunk::~DataChunk(&scan_chunk);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&scan_types);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&new_types);
  sVar7.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::RowGroupCollection,_true>)
         sVar7.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowGroupCollection> RowGroupCollection::AlterType(ClientContext &context, idx_t changed_idx,
                                                             const LogicalType &target_type,
                                                             vector<StorageIndex> bound_columns,
                                                             Expression &cast_expr) {
	D_ASSERT(changed_idx < types.size());
	auto new_types = types;
	new_types[changed_idx] = target_type;

	auto result = make_shared_ptr<RowGroupCollection>(info, block_manager, std::move(new_types), row_start,
	                                                  total_rows.load(), row_group_size);
	result->stats.InitializeAlterType(stats, changed_idx, target_type);

	vector<LogicalType> scan_types;
	for (idx_t i = 0; i < bound_columns.size(); i++) {
		if (bound_columns[i].IsRowIdColumn()) {
			scan_types.emplace_back(LogicalType::ROW_TYPE);
		} else {
			scan_types.push_back(types[bound_columns[i].GetPrimaryIndex()]);
		}
	}
	DataChunk scan_chunk;
	scan_chunk.Initialize(GetAllocator(), scan_types);

	ExpressionExecutor executor(context);
	executor.AddExpression(cast_expr);

	TableScanState scan_state;
	scan_state.Initialize(bound_columns);
	scan_state.table_state.max_row = row_start + total_rows;

	// now alter the type of the column within all of the row_groups individually
	auto lock = result->stats.GetLock();
	auto &changed_stats = result->stats.GetStats(*lock, changed_idx);
	for (auto &current_row_group : row_groups->Segments()) {
		auto new_row_group = current_row_group.AlterType(*result, target_type, changed_idx, executor,
		                                                 scan_state.table_state, scan_chunk);
		new_row_group->MergeIntoStatistics(changed_idx, changed_stats.Statistics());
		result->row_groups->AppendSegment(std::move(new_row_group));
	}
	return result;
}